

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintTools.h
# Opt level: O0

string * PrintTools::SoftPrintVector<Globals::reward_t>
                   (vector<Globals::reward_t,_std::allocator<Globals::reward_t>_> *v)

{
  bool bVar1;
  string *in_RDI;
  const_iterator last;
  const_iterator it;
  stringstream ss;
  vector<Globals::reward_t,_std::allocator<Globals::reward_t>_> *in_stack_fffffffffffffdf8;
  ostream *in_stack_fffffffffffffe00;
  string *this;
  string local_1e0 [32];
  reward_t *local_1c0;
  reward_t *local_1a8;
  __normal_iterator<const_Globals::reward_t_*,_std::vector<Globals::reward_t,_std::allocator<Globals::reward_t>_>_>
  local_1a0;
  stringstream local_198 [16];
  ostream local_188 [288];
  reward_t *in_stack_ffffffffffffff98;
  
  this = in_RDI;
  std::__cxx11::stringstream::stringstream(local_198);
  local_1a0._M_current =
       (reward_t *)
       std::vector<Globals::reward_t,_std::allocator<Globals::reward_t>_>::begin
                 (in_stack_fffffffffffffdf8);
  local_1a8 = (reward_t *)
              std::vector<Globals::reward_t,_std::allocator<Globals::reward_t>_>::end
                        (in_stack_fffffffffffffdf8);
  std::operator<<(local_188,"< ");
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Globals::reward_t_*,_std::vector<Globals::reward_t,_std::allocator<Globals::reward_t>_>_>
                             *)in_stack_fffffffffffffe00,
                            (__normal_iterator<const_Globals::reward_t_*,_std::vector<Globals::reward_t,_std::allocator<Globals::reward_t>_>_>
                             *)in_stack_fffffffffffffdf8), bVar1) {
    local_1c0 = (reward_t *)
                std::vector<Globals::reward_t,_std::allocator<Globals::reward_t>_>::begin
                          (in_stack_fffffffffffffdf8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Globals::reward_t_*,_std::vector<Globals::reward_t,_std::allocator<Globals::reward_t>_>_>
                        *)in_stack_fffffffffffffe00,
                       (__normal_iterator<const_Globals::reward_t_*,_std::vector<Globals::reward_t,_std::allocator<Globals::reward_t>_>_>
                        *)in_stack_fffffffffffffdf8);
    if (bVar1) {
      std::operator<<(local_188,", ");
    }
    in_stack_fffffffffffffe00 = local_188;
    __gnu_cxx::
    __normal_iterator<const_Globals::reward_t_*,_std::vector<Globals::reward_t,_std::allocator<Globals::reward_t>_>_>
    ::operator*(&local_1a0);
    SoftPrintVector<Globals::reward_t>(in_stack_ffffffffffffff98);
    std::operator<<(in_stack_fffffffffffffe00,local_1e0);
    std::__cxx11::string::~string(local_1e0);
    __gnu_cxx::
    __normal_iterator<const_Globals::reward_t_*,_std::vector<Globals::reward_t,_std::allocator<Globals::reward_t>_>_>
    ::operator++((__normal_iterator<const_Globals::reward_t_*,_std::vector<Globals::reward_t,_std::allocator<Globals::reward_t>_>_>
                  *)this,(int)((ulong)in_stack_fffffffffffffe00 >> 0x20));
  }
  std::operator<<(local_188," >");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

static std::string SoftPrintVector(const std::vector<T> &v)
{
    std::stringstream ss;
    typename std::vector<T>::const_iterator it =  v.begin();
    typename std::vector<T>::const_iterator last =  v.end();
    ss << "< ";
    while(it != last)
    {
        if(it != v.begin())
            ss << ", ";

        ss << SoftPrintVector(*it);        
        it++;
    }
    ss << " >";
    return(ss.str());
}